

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

void anon_unknown.dwarf_ebf5::eatExpectedString(istream *in,char *str)

{
  istream *piVar1;
  ulong uVar2;
  KatException *this;
  undefined1 local_40 [8];
  string msg;
  char *pcStack_18;
  char c;
  char *str_local;
  istream *in_local;
  
  pcStack_18 = str;
  while( true ) {
    if (*pcStack_18 == '\0') {
      return;
    }
    piVar1 = std::operator>>(in,msg.field_2._M_local_buf + 0xf);
    uVar2 = std::ios::operator!((ios *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18)));
    if (((uVar2 & 1) != 0) || (msg.field_2._M_local_buf[0xf] != *pcStack_18)) break;
    pcStack_18 = pcStack_18 + 1;
  }
  std::__cxx11::string::string((string *)local_40);
  std::__cxx11::string::append((char *)local_40);
  std::__cxx11::string::append((ulong)local_40,'\x01');
  std::__cxx11::string::append(local_40);
  this = (KatException *)__cxa_allocate_exception(0x10);
  KatException::KatException(this,(string *)local_40);
  __cxa_throw(this,&(anonymous_namespace)::KatException::typeinfo,KatException::~KatException);
}

Assistant:

void eatExpectedString(std::istream &in, const char *str)
    {
        char c;
        while (*str != '\0')
        {
            if (!(in >> c) || c != *str)
            {
                std::string msg;
                msg.append("unexpected character '");
                msg.append(1, c);
                msg.append("'");
                throw KatException(msg);
            }
            ++str;
        }
    }